

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O3

int Map_LibraryReadFileTreeStr
              (Map_SuperLib_t *pLib,Mio_Library_t *pGenlib,Vec_Str_t *vStr,char *pFileName)

{
  byte bVar1;
  int *piVar2;
  Map_SuperLib_t *pLib_00;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  char *pName1;
  Map_Super_t **ppMVar6;
  Map_Super_t *pMVar7;
  ProgressBar *p;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  Map_SuperLib_t *pMVar11;
  byte *pbVar12;
  long lVar13;
  ulong uVar14;
  int nPos;
  char pBuffer [5000];
  int local_13d4;
  int *local_13d0;
  Map_SuperLib_t *local_13c8;
  int *local_13c0;
  byte local_13b8 [5000];
  
  local_13d4 = 0;
  iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
  if (iVar4 == 0) {
    return 0;
  }
  pbVar12 = local_13b8;
  local_13d0 = (int *)pFileName;
  local_13c8 = pLib;
  while (uVar14 = (ulong)*pbVar12, uVar14 < 0x24) {
    if ((0x100002400U >> (uVar14 & 0x3f) & 1) == 0) {
      if ((0x800000001U >> (uVar14 & 0x3f) & 1) == 0) break;
      iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
      pbVar12 = local_13b8;
      if (iVar4 == 0) {
        return 0;
      }
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
  }
  pcVar5 = strtok((char *)pbVar12," \t\r\n");
  pMVar11 = local_13c8;
  local_13c8->pGenlib = pGenlib;
  if (pGenlib != (Mio_Library_t *)0x0) {
    pName1 = Mio_LibraryReadName(pGenlib);
    iVar4 = Map_LibraryCompareLibNames(pName1,pcVar5);
    if (iVar4 == 0) {
      iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
      if (iVar4 == 0) {
        return 0;
      }
      __isoc99_sscanf(local_13b8,"%d\n",&pMVar11->nVarsMax);
      if (pMVar11->nVarsMax - 0xbU < 0xfffffff7) {
        pcVar5 = "Suspicious number of variables (%d).\n";
      }
      else {
        iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
        if (iVar4 == 0) {
          return 0;
        }
        __isoc99_sscanf(local_13b8,"%d\n",&pMVar11->nSupersReal);
        if (0xff67697f < pMVar11->nSupersReal - 0x989681U) {
          iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
          if (iVar4 == 0) {
            return 0;
          }
          __isoc99_sscanf(local_13b8,"%d\n",&pMVar11->nLines);
          uVar10 = pMVar11->nLines;
          if (uVar10 - 0x989681 < 0xff676980) {
            printf("Suspicious number of lines (%d).\n",(ulong)uVar10);
            return 0;
          }
          local_13d0 = &pMVar11->nLines;
          local_13c0 = &pMVar11->nSupersReal;
          ppMVar6 = (Map_Super_t **)malloc((ulong)uVar10 * 8 + 80000);
          pMVar11->ppSupers = ppMVar6;
          uVar14 = (ulong)(uint)pMVar11->nVarsMax;
          if (0 < pMVar11->nVarsMax) {
            lVar13 = 0;
            do {
              pMVar7 = (Map_Super_t *)Extra_MmFixedEntryFetch(pMVar11->mmSupers);
              memset(pMVar7,0,0x100);
              pMVar7->Num = (int)lVar13;
              pMVar7->uTruth[0] = pMVar11->uTruths[lVar13][0];
              pMVar7->uTruth[1] = pMVar11->uTruths[lVar13][1];
              uVar14 = (ulong)pMVar11->nVarsMax;
              if (0 < (long)uVar14) {
                lVar8 = 0;
                do {
                  *(undefined8 *)((long)&pMVar7->tDelaysR[0].Rise + lVar8) = 0xc61c3c00c61c3c00;
                  *(undefined8 *)((long)&pMVar7->tDelaysF[0].Rise + lVar8) = 0xc61c3c00c61c3c00;
                  lVar8 = lVar8 + 0xc;
                } while (uVar14 * 0xc != lVar8);
              }
              pMVar7->tDelaysR[lVar13].Rise = 0.0;
              pMVar7->tDelaysF[lVar13].Fall = 0.0;
              pMVar11->ppSupers[lVar13] = pMVar7;
              lVar13 = lVar13 + 1;
            } while (lVar13 < (long)uVar14);
            uVar10 = *local_13d0;
          }
          p = Extra_ProgressBarStart(_stdout,uVar10);
          iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
          pLib_00 = local_13c8;
          if (iVar4 != 0) {
            uVar14 = (ulong)(int)uVar14;
            pbVar12 = local_13b8;
LAB_004026f5:
            do {
              bVar1 = *pbVar12;
              if (bVar1 < 0xd) {
                if (bVar1 != 0) {
                  if (bVar1 != 10) goto LAB_00402733;
LAB_00402712:
                  pbVar12 = pbVar12 + 1;
                  goto LAB_004026f5;
                }
                iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
                pMVar11 = local_13c8;
              }
              else {
                if ((bVar1 == 0x20) || (bVar1 == 0xd)) goto LAB_00402712;
LAB_00402733:
                pMVar7 = Map_LibraryReadGateTree
                                   (pLib_00,(char *)pbVar12,(int)uVar14,pLib_00->nVarsMax);
                if (pMVar7 == (Map_Super_t *)0x0) {
                  Extra_ProgressBarStop(p);
                  return 0;
                }
                uVar9 = uVar14 + 1;
                pLib_00->ppSupers[uVar14] = pMVar7;
                if ((p == (ProgressBar *)0x0) || ((long)p->nItemsNext <= (long)uVar9)) {
                  Extra_ProgressBarUpdate_int(p,(int)uVar9,(char *)0x0);
                }
                iVar4 = Vec_StrGets((char *)local_13b8,5000,vStr,&local_13d4);
                uVar14 = uVar9;
                pMVar11 = local_13c8;
              }
              pbVar12 = local_13b8;
              local_13c8 = pMVar11;
            } while (iVar4 != 0);
          }
          Extra_ProgressBarStop(p);
          piVar3 = local_13c0;
          piVar2 = local_13d0;
          uVar9 = uVar14 & 0xffffffff;
          if ((uint)uVar14 != *local_13d0) {
            printf("The number of lines read (%d) is different from what the file says (%d).\n",
                   uVar14 & 0xffffffff);
            uVar9 = (ulong)(uint)*piVar2;
          }
          pMVar11->nSupersAll = (uint)uVar14;
          if ((int)uVar9 < 1) {
            uVar10 = 0;
          }
          else {
            uVar14 = 0;
            uVar10 = 0;
            do {
              uVar10 = uVar10 + (*(uint *)&pMVar11->ppSupers[uVar14]->field_0x4 & 1);
              uVar14 = uVar14 + 1;
            } while (uVar9 != uVar14);
          }
          if (uVar10 != *piVar3) {
            printf("The number of gates read (%d) is different what the file says (%d).\n",
                   (ulong)uVar10);
          }
          *piVar3 = uVar10;
          return 1;
        }
        pcVar5 = "Suspicious number of gates (%d).\n";
      }
      printf(pcVar5);
      return 0;
    }
  }
  printf("Supergate library \"%s\" requires the use of genlib library \"%s\".\n",local_13d0,pcVar5);
  return 0;
}

Assistant:

int Map_LibraryReadFileTreeStr( Map_SuperLib_t * pLib, Mio_Library_t * pGenlib, Vec_Str_t * vStr, char * pFileName )
{
    ProgressBar * pProgress;
    char pBuffer[5000];
    Map_Super_t * pGate;
    char * pTemp = 0, * pLibName;
    int nCounter, k, i;
    int RetValue, nPos = 0;

    // skip empty and comment lines
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( 1 )
    {
        RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
        if ( RetValue == 0 )
            return 0;
        // skip leading spaces
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        // skip comment lines and empty lines
        if ( *pTemp != 0 && *pTemp != '#' )
            break;
    }

    pLibName = strtok( pTemp, " \t\r\n" );
//    pLib->pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    pLib->pGenlib = pGenlib;
//    if ( pLib->pGenlib == NULL || strcmp( , pLibName ) )
    if ( pLib->pGenlib == NULL || Map_LibraryCompareLibNames(Mio_LibraryReadName(pLib->pGenlib), pLibName) )
    {
        printf( "Supergate library \"%s\" requires the use of genlib library \"%s\".\n", pFileName, pLibName );
        return 0;
    }

    // read the number of variables
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nVarsMax );
    if ( pLib->nVarsMax < 2 || pLib->nVarsMax > 10 )
    {
        printf( "Suspicious number of variables (%d).\n", pLib->nVarsMax );
        return 0;
    }

    // read the number of gates
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nSupersReal );
    if ( pLib->nSupersReal < 1 || pLib->nSupersReal > 10000000 )
    {
        printf( "Suspicious number of gates (%d).\n", pLib->nSupersReal );
        return 0;
    }

    // read the number of lines
    RetValue = Vec_StrGets( pBuffer, 5000, vStr, &nPos );
    if ( RetValue == 0 )
        return 0;
    RetValue = sscanf( pBuffer, "%d\n", &pLib->nLines );
    if ( pLib->nLines < 1 || pLib->nLines > 10000000 )
    {
        printf( "Suspicious number of lines (%d).\n", pLib->nLines );
        return 0;
    }

    // allocate room for supergate pointers
    pLib->ppSupers = ABC_ALLOC( Map_Super_t *, pLib->nLines + 10000 );

    // create the elementary supergates
    for ( i = 0; i < pLib->nVarsMax; i++ )
    {
        // get a new gate
        pGate = (Map_Super_t *)Extra_MmFixedEntryFetch( pLib->mmSupers );
        memset( pGate, 0, sizeof(Map_Super_t) );
        // assign the elementary variable, the truth table, and the delays
        pGate->Num = i;
        // set the truth table
        pGate->uTruth[0] = pLib->uTruths[i][0];
        pGate->uTruth[1] = pLib->uTruths[i][1];
        // set the arrival times of all input to non-existent delay
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            pGate->tDelaysR[k].Rise = pGate->tDelaysR[k].Fall = MAP_NO_VAR;
            pGate->tDelaysF[k].Rise = pGate->tDelaysF[k].Fall = MAP_NO_VAR;
        }
        // set an existent arrival time for rise and fall
        pGate->tDelaysR[i].Rise = 0.0;
        pGate->tDelaysF[i].Fall = 0.0;
        // set the gate
        pLib->ppSupers[i] = pGate;
    }

    // read the lines
    nCounter = pLib->nVarsMax;
    pProgress = Extra_ProgressBarStart( stdout, pLib->nLines );
//    while ( fgets( pBuffer, 5000, pFile ) != NULL )
    while ( Vec_StrGets( pBuffer, 5000, vStr, &nPos ) )
    {
        for ( pTemp = pBuffer; *pTemp == ' ' || *pTemp == '\r' || *pTemp == '\n'; pTemp++ );
        if ( pTemp[0] == '\0' )
            continue;
//        if ( pTemp[0] == 'a' || pTemp[2] == 'a' )
//        {
//            pLib->nLines--;
//            continue;
//        }

        // get the gate
        pGate = Map_LibraryReadGateTree( pLib, pTemp, nCounter, pLib->nVarsMax );
        if ( pGate == NULL )
        {
            Extra_ProgressBarStop( pProgress );
            return 0;
        }
        pLib->ppSupers[nCounter++] = pGate;
        // later we will derive: truth table, delays, area, number of component gates, etc

        // update the progress bar
        Extra_ProgressBarUpdate( pProgress, nCounter, NULL );
    }
    Extra_ProgressBarStop( pProgress );
    if ( nCounter != pLib->nLines )
        printf( "The number of lines read (%d) is different from what the file says (%d).\n", nCounter, pLib->nLines );
    pLib->nSupersAll = nCounter;
    // count the number of real supergates
    nCounter = 0;
    for ( k = 0; k < pLib->nLines; k++ )
        nCounter += pLib->ppSupers[k]->fSuper;
    if ( nCounter != pLib->nSupersReal )
        printf( "The number of gates read (%d) is different what the file says (%d).\n", nCounter, pLib->nSupersReal );
    pLib->nSupersReal = nCounter;
    return 1;
}